

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMRangeImpl::receiveReplacedText(DOMRangeImpl *this,DOMNode *node)

{
  uint uVar1;
  
  if (node != (DOMNode *)0x0) {
    uVar1 = (*this->fStartContainer->_vptr_DOMNode[4])();
    if (((this->fStartContainer == node) && ((ushort)uVar1 < 9)) &&
       ((0x198U >> (uVar1 & 0x1f) & 1) != 0)) {
      this->fStartOffset = 0;
    }
    uVar1 = (*this->fEndContainer->_vptr_DOMNode[4])();
    if (((this->fEndContainer == node) && ((ushort)uVar1 < 9)) &&
       ((0x198U >> (uVar1 & 0x1f) & 1) != 0)) {
      this->fEndOffset = 0;
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::receiveReplacedText(DOMNode* node)
{
    if (node == 0) return;

    short type = fStartContainer->getNodeType();
    if (node == fStartContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        fStartOffset = 0;
    }
    type = fEndContainer->getNodeType();
    if (node == fEndContainer
        && (type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE))
    {
        fEndOffset = 0;
    }
}